

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void encode_cache_cpuid8000001d
               (CPUCacheInfo *cache,X86CPUTopoInfo *topo_info,uint32_t *eax,uint32_t *ebx,
               uint32_t *ecx,uint32_t *edx)

{
  uint uVar1;
  uint uVar2;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint nodes;
  uint32_t l3_cores;
  uint32_t *edx_local;
  uint32_t *ecx_local;
  uint32_t *ebx_local;
  uint32_t *eax_local;
  X86CPUTopoInfo *topo_info_local;
  CPUCacheInfo *cache_local;
  
  if (topo_info->nodes_per_pkg < 2) {
    local_44 = 1;
  }
  else {
    local_44 = topo_info->nodes_per_pkg;
  }
  if (cache->size !=
      (uint)cache->line_size * (uint)cache->associativity * (uint)cache->partitions * cache->sets) {
    __assert_fail("cache->size == cache->line_size * cache->associativity * cache->partitions * cache->sets"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x146,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (cache->type == DATA_CACHE) {
    local_48 = 1;
  }
  else {
    if (cache->type == INSTRUCTION_CACHE) {
      local_4c = 2;
    }
    else {
      local_4c = 0;
      if (cache->type == UNIFIED_CACHE) {
        local_4c = 3;
      }
    }
    local_48 = local_4c;
  }
  uVar1 = 0;
  if ((cache->self_init & 1U) != 0) {
    uVar1 = 0x100;
  }
  *eax = local_48 | (uint)cache->level << 5 | uVar1;
  if (cache->level == '\x03') {
    *eax = (((topo_info->dies_per_pkg * topo_info->cores_per_die * topo_info->threads_per_core +
             local_44) - 1) / local_44 - 1) * 0x4000 | *eax;
  }
  else {
    *eax = (topo_info->threads_per_core - 1) * 0x4000 | *eax;
  }
  if (cache->line_size == 0) {
    __assert_fail("cache->line_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x156,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (cache->partitions == '\0') {
    __assert_fail("cache->partitions > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x157,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (cache->associativity == '\0') {
    __assert_fail("cache->associativity > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x158,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (cache->sets <= (uint)cache->associativity) {
    __assert_fail("cache->associativity < cache->sets",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x15a,
                  "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  *ebx = cache->line_size - 1 | (cache->partitions - 1) * 0x1000 |
         (cache->associativity - 1) * 0x400000;
  if (cache->sets != 0) {
    *ecx = cache->sets - 1;
    uVar1 = 0;
    if ((cache->inclusive & 1U) != 0) {
      uVar1 = 2;
    }
    uVar2 = 0;
    if ((cache->complex_indexing & 1U) != 0) {
      uVar2 = 4;
    }
    *edx = (cache->no_invd_sharing & 1U) != 0 | uVar1 | uVar2;
    return;
  }
  __assert_fail("cache->sets > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                ,0x15f,
                "void encode_cache_cpuid8000001d(CPUCacheInfo *, X86CPUTopoInfo *, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
               );
}

Assistant:

static void encode_cache_cpuid8000001d(CPUCacheInfo *cache,
                                       X86CPUTopoInfo *topo_info,
                                       uint32_t *eax, uint32_t *ebx,
                                       uint32_t *ecx, uint32_t *edx)
{
    uint32_t l3_cores;
    unsigned nodes = MAX(topo_info->nodes_per_pkg, 1);

    assert(cache->size == cache->line_size * cache->associativity *
                          cache->partitions * cache->sets);

    *eax = CACHE_TYPE(cache->type) | CACHE_LEVEL(cache->level) |
               (cache->self_init ? CACHE_SELF_INIT_LEVEL : 0);

    /* L3 is shared among multiple cores */
    if (cache->level == 3) {
        l3_cores = DIV_ROUND_UP((topo_info->dies_per_pkg *
                                 topo_info->cores_per_die *
                                 topo_info->threads_per_core),
                                 nodes);
        *eax |= (l3_cores - 1) << 14;
    } else {
        *eax |= ((topo_info->threads_per_core - 1) << 14);
    }

    assert(cache->line_size > 0);
    assert(cache->partitions > 0);
    assert(cache->associativity > 0);
    /* We don't implement fully-associative caches */
    assert(cache->associativity < cache->sets);
    *ebx = (cache->line_size - 1) |
           ((cache->partitions - 1) << 12) |
           ((cache->associativity - 1) << 22);

    assert(cache->sets > 0);
    *ecx = cache->sets - 1;

    *edx = (cache->no_invd_sharing ? CACHE_NO_INVD_SHARING : 0) |
           (cache->inclusive ? CACHE_INCLUSIVE : 0) |
           (cache->complex_indexing ? CACHE_COMPLEX_IDX : 0);
}